

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O2

void __thiscall wasm::DataFlow::Printer::print(Printer *this,Node *node)

{
  pointer ppNVar1;
  pointer ppNVar2;
  int iVar3;
  Node *pNVar4;
  ostream *poVar5;
  Type type;
  size_type sVar6;
  char *pcVar7;
  Index i;
  ulong uVar8;
  Node *local_40;
  Node *block;
  
  pNVar4 = getMaybeReplaced(this,node);
  block = pNVar4;
  if (pNVar4 == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x1c9,"void wasm::DataFlow::Printer::print(Node *)");
  }
  switch(pNVar4->type) {
  case Var:
    poVar5 = std::operator<<((ostream *)&std::cout,"%");
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = wasm::operator<<(poVar5,(Type)(block->field_1).wasmType.id);
    pcVar7 = " = var";
    goto LAB_00bd7092;
  case Expr:
    iVar3 = debug();
    if (iVar3 != 0) {
      std::operator<<((ostream *)&std::cout,"; ");
      poVar5 = std::operator<<((ostream *)&std::cout,(pNVar4->field_1).expr);
      std::operator<<(poVar5,'\n');
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"%");
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5," = ");
    printExpression(this,block);
    break;
  case Phi:
    local_40 = Node::getValue(pNVar4,0);
    ppNVar1 = (local_40->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppNVar2 = (local_40->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    poVar5 = std::operator<<((ostream *)&std::cout,"%");
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," = phi %");
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&local_40);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    for (uVar8 = 1; uVar8 < ((long)ppNVar1 - (long)ppNVar2 >> 3) + 1U;
        uVar8 = (ulong)((Index)uVar8 + 1)) {
      std::operator<<((ostream *)&std::cout,", ");
      pNVar4 = Node::getValue(block,(Index)uVar8);
      printInternal(this,pNVar4);
    }
    break;
  case Cond:
    poVar5 = std::operator<<((ostream *)&std::cout,"blockpc %");
    local_40 = Node::getValue(pNVar4,0);
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&local_40);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,' ');
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,' ');
    pNVar4 = Node::getValue(block,1);
    printInternal(this,pNVar4);
    pcVar7 = " 1:i1";
    poVar5 = (ostream *)&std::cout;
LAB_00bd7092:
    std::operator<<(poVar5,pcVar7);
    break;
  case Block:
    poVar5 = std::operator<<((ostream *)&std::cout,"%");
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," = block ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    break;
  case Zext:
    pNVar4 = Node::getValue(pNVar4,0);
    poVar5 = std::operator<<((ostream *)&std::cout,"%");
    std::__detail::
    _Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_unsigned_int>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->indexing,&block);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,':');
    type = Node::getWasmType(pNVar4);
    wasm::operator<<(poVar5,type);
    std::operator<<((ostream *)&std::cout," = zext ");
    printInternal(this,pNVar4);
    break;
  case Bad:
    handle_unreachable("!!!BAD!!!",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x1f6);
  default:
    handle_unreachable("unexpted type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                       ,0x1f9);
  }
  if (((block->type - Expr < 2) && (block->origin != this->trace->toInfer->origin)) &&
     (sVar6 = std::
              _Hashtable<wasm::DataFlow::Node_*,_wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>,_std::__detail::_Identity,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->trace->hasExternalUses)._M_h,&block), sVar6 != 0)) {
    std::operator<<((ostream *)&std::cout," (hasExternalUses)");
    this->printedHasExternalUses = true;
  }
  std::operator<<((ostream *)&std::cout,'\n');
  iVar3 = debug();
  if ((iVar3 != 0) && (block->type - Expr < 2)) {
    warnOnSuspiciousValues(this,block);
  }
  return;
}

Assistant:

void print(Node* node) {
    // The node may have been replaced during trace building, if so then
    // print the proper replacement.
    node = getMaybeReplaced(node);
    assert(node);
    switch (node->type) {
      case Node::Type::Var: {
        std::cout << "%" << indexing[node] << ":" << node->wasmType << " = var";
        break; // nothing more to add
      }
      case Node::Type::Expr: {
        if (debug()) {
          std::cout << "; ";
          std::cout << *node->expr << '\n';
        }
        std::cout << "%" << indexing[node] << " = ";
        printExpression(node);
        break;
      }
      case Node::Type::Phi: {
        auto* block = node->getValue(0);
        auto size = block->values.size();
        std::cout << "%" << indexing[node] << " = phi %" << indexing[block];
        for (Index i = 1; i < size + 1; i++) {
          std::cout << ", ";
          printInternal(node->getValue(i));
        }
        break;
      }
      case Node::Type::Cond: {
        std::cout << "blockpc %" << indexing[node->getValue(0)] << ' '
                  << node->index << ' ';
        printInternal(node->getValue(1));
        std::cout << " 1:i1";
        break;
      }
      case Node::Type::Block: {
        std::cout << "%" << indexing[node] << " = block "
                  << node->values.size();
        break;
      }
      case Node::Type::Zext: {
        auto* child = node->getValue(0);
        std::cout << "%" << indexing[node] << ':' << child->getWasmType();
        std::cout << " = zext ";
        printInternal(child);
        break;
      }
      case Node::Type::Bad: {
        WASM_UNREACHABLE("!!!BAD!!!");
      }
      default:
        WASM_UNREACHABLE("unexpted type");
    }
    if (node->isExpr() || node->isPhi()) {
      if (node->origin != trace.toInfer->origin &&
          trace.hasExternalUses.count(node) > 0) {
        std::cout << " (hasExternalUses)";
        printedHasExternalUses = true;
      }
    }
    std::cout << '\n';
    if (debug() && (node->isExpr() || node->isPhi())) {
      warnOnSuspiciousValues(node);
    }
  }